

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::SetRawIssueAssetRequest,cfd::js::api::json::SetRawIssueAssetResponse,cfd::js::api::SetRawIssueAssetRequestStruct,cfd::js::api::SetRawIssueAssetResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_550;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_498 [4];
  JsonClassBase<cfd::js::api::json::SetRawIssueAssetResponse> local_478 [4];
  undefined1 local_458 [8];
  SetRawIssueAssetResponse res_2;
  undefined1 local_3d8 [8];
  SetRawIssueAssetResponseStruct response;
  SetRawIssueAssetRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_a0 [8];
  SetRawIssueAssetRequest req;
  function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req.issuances_.super_JsonVector<cfd::js::api::json::IssuanceDataRequest>.
  super_vector<cfd::js::api::json::IssuanceDataRequest,_std::allocator<cfd::js::api::json::IssuanceDataRequest>_>
  .
  super__Vector_base<cfd::js::api::json::IssuanceDataRequest,_std::allocator<cfd::js::api::json::IssuanceDataRequest>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)call_function;
  SetRawIssueAssetRequest::SetRawIssueAssetRequest((SetRawIssueAssetRequest *)local_a0);
  core::JsonClassBase<cfd::js::api::json::SetRawIssueAssetRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::SetRawIssueAssetRequest> *)local_a0,request_message)
  ;
  SetRawIssueAssetRequest::ConvertToStruct
            ((SetRawIssueAssetRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (SetRawIssueAssetRequest *)local_a0);
  std::
  function<cfd::js::api::SetRawIssueAssetResponseStruct_(const_cfd::js::api::SetRawIssueAssetRequestStruct_&)>
  ::operator()((SetRawIssueAssetResponseStruct *)local_3d8,call_function,
               (SetRawIssueAssetRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2.issuances_.super_JsonVector<cfd::js::api::json::IssuanceDataResponse>.
  super_vector<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  .
  super__Vector_base<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if ((int)response.issuances.
           super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    SetRawIssueAssetResponse::SetRawIssueAssetResponse((SetRawIssueAssetResponse *)local_458);
    SetRawIssueAssetResponse::ConvertFromStruct
              ((SetRawIssueAssetResponse *)local_458,(SetRawIssueAssetResponseStruct *)local_3d8);
    core::JsonClassBase<cfd::js::api::json::SetRawIssueAssetResponse>::Serialize_abi_cxx11_
              (local_478);
    std::__cxx11::string::operator=((string *)this,(string *)local_478);
    std::__cxx11::string::~string((string *)local_478);
    SetRawIssueAssetResponse::~SetRawIssueAssetResponse((SetRawIssueAssetResponse *)local_458);
  }
  else {
    ErrorResponse::ConvertFromStruct
              (&local_550,
               (InnerErrorResponseStruct *)
               &response.issuances.
                super__Vector_base<cfd::js::api::IssuanceDataResponseStruct,_std::allocator<cfd::js::api::IssuanceDataResponseStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_498);
    std::__cxx11::string::operator=((string *)this,(string *)local_498);
    std::__cxx11::string::~string((string *)local_498);
    ErrorResponse::~ErrorResponse(&local_550);
  }
  res_2.issuances_.super_JsonVector<cfd::js::api::json::IssuanceDataResponse>.
  super_vector<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  .
  super__Vector_base<cfd::js::api::json::IssuanceDataResponse,_std::allocator<cfd::js::api::json::IssuanceDataResponse>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  SetRawIssueAssetResponseStruct::~SetRawIssueAssetResponseStruct
            ((SetRawIssueAssetResponseStruct *)local_3d8);
  SetRawIssueAssetRequestStruct::~SetRawIssueAssetRequestStruct
            ((SetRawIssueAssetRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  SetRawIssueAssetRequest::~SetRawIssueAssetRequest((SetRawIssueAssetRequest *)local_a0);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}